

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_encode_utils.c
# Opt level: O0

void OptimizeHuffmanForRle(int length,uint8_t *good_for_rle,uint32_t *counts)

{
  int iVar1;
  uint *in_RDX;
  long in_RSI;
  int in_EDI;
  uint32_t count;
  uint32_t k_1;
  uint32_t sum;
  uint32_t limit;
  uint32_t stride_1;
  int k;
  int stride;
  uint32_t symbol;
  int i;
  uint local_3c;
  uint local_38;
  int local_34;
  uint local_30;
  uint local_2c;
  int local_28;
  int local_24;
  uint local_20;
  int local_1c;
  int local_4;
  
  for (local_4 = in_EDI; -1 < local_4; local_4 = local_4 + -1) {
    if (local_4 == 0) {
      return;
    }
    if (in_RDX[local_4 + -1] != 0) break;
  }
  local_20 = *in_RDX;
  local_24 = 0;
  for (local_1c = 0; local_1c < local_4 + 1; local_1c = local_1c + 1) {
    if ((local_1c == local_4) || (in_RDX[local_1c] != local_20)) {
      if (((local_20 == 0) && (4 < local_24)) || ((local_20 != 0 && (6 < local_24)))) {
        for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
          *(undefined1 *)(in_RSI + ((local_1c - local_28) + -1)) = 1;
        }
      }
      local_24 = 1;
      if (local_1c != local_4) {
        local_20 = in_RDX[local_1c];
      }
    }
    else {
      local_24 = local_24 + 1;
    }
  }
  local_2c = 0;
  local_30 = *in_RDX;
  local_34 = 0;
  for (local_1c = 0; local_1c < local_4 + 1; local_1c = local_1c + 1) {
    if ((((local_1c == local_4) || (*(char *)(in_RSI + local_1c) != '\0')) ||
        ((local_1c != 0 && (*(char *)(in_RSI + (local_1c + -1)) != '\0')))) ||
       (iVar1 = ValuesShouldBeCollapsedToStrideAverage(in_RDX[local_1c],local_30), iVar1 == 0)) {
      if ((3 < local_2c) || ((2 < local_2c && (local_34 == 0)))) {
        local_3c = (local_34 + (local_2c >> 1)) / local_2c;
        if (local_3c == 0) {
          local_3c = 1;
        }
        if (local_34 == 0) {
          local_3c = 0;
        }
        for (local_38 = 0; local_38 < local_2c; local_38 = local_38 + 1) {
          in_RDX[(local_1c - local_38) - 1] = local_3c;
        }
      }
      local_2c = 0;
      local_34 = 0;
      if (local_1c < local_4 + -3) {
        local_30 = in_RDX[local_1c] + in_RDX[local_1c + 1] + in_RDX[local_1c + 2] +
                   in_RDX[local_1c + 3] + 2 >> 2;
      }
      else if (local_1c < local_4) {
        local_30 = in_RDX[local_1c];
      }
      else {
        local_30 = 0;
      }
    }
    local_2c = local_2c + 1;
    if ((local_1c != local_4) && (local_34 = in_RDX[local_1c] + local_34, 3 < local_2c)) {
      local_30 = (local_34 + (local_2c >> 1)) / local_2c;
    }
  }
  return;
}

Assistant:

static void OptimizeHuffmanForRle(int length, uint8_t* const good_for_rle,
                                  uint32_t* const counts) {
  // 1) Let's make the Huffman code more compatible with rle encoding.
  int i;
  for (; length >= 0; --length) {
    if (length == 0) {
      return;  // All zeros.
    }
    if (counts[length - 1] != 0) {
      // Now counts[0..length - 1] does not have trailing zeros.
      break;
    }
  }
  // 2) Let's mark all population counts that already can be encoded
  // with an rle code.
  {
    // Let's not spoil any of the existing good rle codes.
    // Mark any seq of 0's that is longer as 5 as a good_for_rle.
    // Mark any seq of non-0's that is longer as 7 as a good_for_rle.
    uint32_t symbol = counts[0];
    int stride = 0;
    for (i = 0; i < length + 1; ++i) {
      if (i == length || counts[i] != symbol) {
        if ((symbol == 0 && stride >= 5) ||
            (symbol != 0 && stride >= 7)) {
          int k;
          for (k = 0; k < stride; ++k) {
            good_for_rle[i - k - 1] = 1;
          }
        }
        stride = 1;
        if (i != length) {
          symbol = counts[i];
        }
      } else {
        ++stride;
      }
    }
  }
  // 3) Let's replace those population counts that lead to more rle codes.
  {
    uint32_t stride = 0;
    uint32_t limit = counts[0];
    uint32_t sum = 0;
    for (i = 0; i < length + 1; ++i) {
      if (i == length || good_for_rle[i] ||
          (i != 0 && good_for_rle[i - 1]) ||
          !ValuesShouldBeCollapsedToStrideAverage(counts[i], limit)) {
        if (stride >= 4 || (stride >= 3 && sum == 0)) {
          uint32_t k;
          // The stride must end, collapse what we have, if we have enough (4).
          uint32_t count = (sum + stride / 2) / stride;
          if (count < 1) {
            count = 1;
          }
          if (sum == 0) {
            // Don't make an all zeros stride to be upgraded to ones.
            count = 0;
          }
          for (k = 0; k < stride; ++k) {
            // We don't want to change value at counts[i],
            // that is already belonging to the next stride. Thus - 1.
            counts[i - k - 1] = count;
          }
        }
        stride = 0;
        sum = 0;
        if (i < length - 3) {
          // All interesting strides have a count of at least 4,
          // at least when non-zeros.
          limit = (counts[i] + counts[i + 1] +
                   counts[i + 2] + counts[i + 3] + 2) / 4;
        } else if (i < length) {
          limit = counts[i];
        } else {
          limit = 0;
        }
      }
      ++stride;
      if (i != length) {
        sum += counts[i];
        if (stride >= 4) {
          limit = (sum + stride / 2) / stride;
        }
      }
    }
  }
}